

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderIndexingTests.cpp
# Opt level: O0

ShaderEvalFunc deqp::gles3::Functional::getArrayCoordsEvalFunc(DataType dataType)

{
  code *pcStack_10;
  DataType dataType_local;
  
  if (dataType == TYPE_FLOAT) {
    pcStack_10 = evalArrayCoordsFloat;
  }
  else if (dataType == TYPE_FLOAT_VEC2) {
    pcStack_10 = evalArrayCoordsVec2;
  }
  else if (dataType == TYPE_FLOAT_VEC3) {
    pcStack_10 = evalArrayCoordsVec3;
  }
  else if (dataType == TYPE_FLOAT_VEC4) {
    pcStack_10 = evalArrayCoordsVec4;
  }
  else {
    pcStack_10 = (ShaderEvalFunc)0x0;
  }
  return pcStack_10;
}

Assistant:

static ShaderEvalFunc getArrayCoordsEvalFunc (DataType dataType)
{
	if (dataType == TYPE_FLOAT)				return evalArrayCoordsFloat;
	else if (dataType == TYPE_FLOAT_VEC2)	return evalArrayCoordsVec2;
	else if (dataType == TYPE_FLOAT_VEC3)	return evalArrayCoordsVec3;
	else if (dataType == TYPE_FLOAT_VEC4)	return evalArrayCoordsVec4;

	DE_FATAL("Invalid data type.");
	return NULL;
}